

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonFormatter.cpp
# Opt level: O1

void __thiscall
cali::JsonFormatter::JsonFormatterImpl::configure(JsonFormatterImpl *this,QuerySpec *spec)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  int iVar3;
  _Base_ptr p_Var4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  p_Var4 = (spec->format).kwargs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(spec->format).kwargs._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair(&local_70,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(p_Var4 + 1));
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 == 0) {
        this->m_opt_pretty = true;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar3 == 0) {
          this->m_opt_quote_all = true;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar3 == 0) {
            this->m_opt_sep_nested = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_70);
            if (iVar3 == 0) {
              this->m_layout = Records;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_70);
              if (iVar3 == 0) {
                this->m_layout = Split;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_70);
                if (iVar3 == 0) {
                  this->m_layout = Object;
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
        operator_delete(local_70.second._M_dataplus._M_p,
                        local_70.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
        operator_delete(local_70.first._M_dataplus._M_p,
                        (ulong)(local_70.first.field_2._M_allocated_capacity + 1));
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  if ((spec->select).selection == List) {
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_70,
               (spec->select).list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (spec->select).list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
    if ((_Base_ptr)local_70.first.field_2._M_allocated_capacity != (_Base_ptr)0x0) {
      psVar2 = &local_70.first._M_string_length;
      (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)local_70.first._M_string_length;
      (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_70.first.field_2._M_allocated_capacity;
      (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_70.first.field_2._8_8_;
      (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)local_70.second._M_dataplus._M_p;
      *(_Rb_tree_header **)(local_70.first.field_2._M_allocated_capacity + 8) =
           &(this->m_selected)._M_t._M_impl.super__Rb_tree_header;
      (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_70.second._M_string_length;
      local_70.first.field_2._M_allocated_capacity = 0;
      local_70.second._M_string_length = 0;
      local_70.first.field_2._8_8_ = psVar2;
      local_70.second._M_dataplus._M_p = (pointer)psVar2;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_70);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->m_aliases)._M_t,&(spec->aliases)._M_t);
  return;
}

Assistant:

void configure(const QuerySpec& spec)
    {
        for (auto p : spec.format.kwargs) {
            if (p.first == "pretty")
                m_opt_pretty = true;
            else if (p.first == "quote-all")
                m_opt_quote_all = true;
            else if (p.first == "separate-nested")
                m_opt_sep_nested = true;
            else if (p.first == "records")
                m_layout = Records;
            else if (p.first == "split")
                m_layout = Split;
            else if (p.first == "object")
                m_layout = Object;
        }

        switch (spec.select.selection) {
        case QuerySpec::AttributeSelection::Default:
        case QuerySpec::AttributeSelection::All:
            // do nothing; default is all
            break;
        case QuerySpec::AttributeSelection::None:
            // doesn't make much sense
            break;
        case QuerySpec::AttributeSelection::List:
            m_selected = std::set<std::string>(spec.select.list.begin(), spec.select.list.end());
            break;
        }

        m_aliases = spec.aliases;
    }